

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test
::TestBody(SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test *this)

{
  bool bVar1;
  WrapperMock *pWVar2;
  MockSpec<int_(SDL_Event_&)> *pMVar3;
  TypedExpectation<int_(SDL_Event_&)> *pTVar4;
  NoEvents *lhs;
  char *message;
  SDLEventsSource *this_00;
  AssertHelper local_1a0;
  Message local_198;
  NoEvents local_189;
  _Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  local_188;
  _Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  local_178 [2];
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  Action<int_(SDL_Event_&)> local_148;
  WithoutMatchers local_121;
  Matcher<SDL_Event_&> local_120;
  MockSpec<int_(SDL_Event_&)> local_108;
  type local_e2;
  type local_e1;
  Action<int_(SDL_Event_&)> local_e0;
  WithoutMatchers local_b9;
  Matcher<SDL_Event_&> local_b8;
  MockSpec<int_(SDL_Event_&)> local_a0;
  type local_7a;
  type local_79;
  Action<int_(SDL_Event_&)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<SDL_Event_&> local_48;
  MockSpec<int_(SDL_Event_&)> local_30;
  SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test *local_10;
  SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test *this_local;
  
  local_10 = this;
  pWVar2 = mock_ptr<solitaire::SDL::WrapperMock>::operator*
                     (&(this->super_SDLEventsSourceTests).sdlMock);
  testing::Matcher<SDL_Event&>::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<SDL_Event&> *)&local_48,(AnythingMatcher *)&testing::_);
  SDL::WrapperMock::gmock_pollEvent(&local_30,pWVar2,&local_48);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<int_(SDL_Event_&)>::operator()
                     (&local_30,local_55,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x2e,"*sdlMock","pollEvent(_)");
  testing::
  Invoke<solitaire::events::SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test::TestBody()::__0>
            (&local_7a);
  testing::Action<int(SDL_Event&)>::
  Action<solitaire::events::SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test::TestBody()::__0,void>
            ((Action<int(SDL_Event&)> *)&local_78,&local_79);
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce(pTVar4,&local_78);
  testing::Action<int_(SDL_Event_&)>::~Action(&local_78);
  testing::internal::MockSpec<int_(SDL_Event_&)>::~MockSpec(&local_30);
  testing::Matcher<SDL_Event_&>::~Matcher(&local_48);
  pWVar2 = mock_ptr<solitaire::SDL::WrapperMock>::operator*
                     (&(this->super_SDLEventsSourceTests).sdlMock);
  testing::Matcher<SDL_Event&>::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<SDL_Event&> *)&local_b8,(AnythingMatcher *)&testing::_);
  SDL::WrapperMock::gmock_pollEvent(&local_a0,pWVar2,&local_b8);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<int_(SDL_Event_&)>::operator()
                     (&local_a0,&local_b9,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x34,"*sdlMock","pollEvent(_)");
  testing::
  Invoke<solitaire::events::SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test::TestBody()::__1>
            (&local_e2);
  testing::Action<int(SDL_Event&)>::
  Action<solitaire::events::SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test::TestBody()::__1,void>
            ((Action<int(SDL_Event&)> *)&local_e0,&local_e1);
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce(pTVar4,&local_e0);
  testing::Action<int_(SDL_Event_&)>::~Action(&local_e0);
  testing::internal::MockSpec<int_(SDL_Event_&)>::~MockSpec(&local_a0);
  testing::Matcher<SDL_Event_&>::~Matcher(&local_b8);
  pWVar2 = mock_ptr<solitaire::SDL::WrapperMock>::operator*
                     (&(this->super_SDLEventsSourceTests).sdlMock);
  testing::Matcher<SDL_Event&>::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<SDL_Event&> *)&local_120,(AnythingMatcher *)&testing::_);
  SDL::WrapperMock::gmock_pollEvent(&local_108,pWVar2,&local_120);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<int_(SDL_Event_&)>::operator()
                     (&local_108,&local_121,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x3a,"*sdlMock","pollEvent(_)");
  testing::Return<int>((testing *)&gtest_ar.message_,0);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_148,(ReturnAction *)&gtest_ar.message_);
  this_00 = (SDLEventsSource *)&local_148;
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (pTVar4,(Action<int_(SDL_Event_&)> *)this_00);
  testing::Action<int_(SDL_Event_&)>::~Action(&local_148);
  testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&gtest_ar.message_);
  testing::internal::MockSpec<int_(SDL_Event_&)>::~MockSpec(&local_108);
  testing::Matcher<SDL_Event_&>::~Matcher(&local_120);
  local_188 = (_Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
               )SDLEventsSource::getEvent
                          ((Event *)&(this->super_SDLEventsSourceTests).eventsSource,this_00);
  local_178[0] = local_188;
  lhs = std::
        get<solitaire::events::NoEvents,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                  ((variant<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                    *)local_178);
  testing::internal::EqHelper::
  Compare<solitaire::events::NoEvents,_solitaire::events::NoEvents,_nullptr>
            ((EqHelper *)local_168,"std::get<NoEvents>(eventsSource.getEvent())","NoEvents {}",lhs,
             &local_189);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
               ,0x3b,message);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONDOWN;
        event.button.button = SDL_BUTTON_RIGHT;
        return 1;
    }));

    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONUP;
        event.button.button = SDL_BUTTON_RIGHT;
        return 1;
    }));

    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Return(0));
    EXPECT_EQ(std::get<NoEvents>(eventsSource.getEvent()), NoEvents {});
}